

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O3

int x86XOR(uchar *stream,x86Size size,x86Reg index,int multiplier,x86Reg base,int shift,x86Reg op2)

{
  uchar *puVar1;
  uint uVar2;
  byte bVar3;
  
  bVar3 = (8 < (int)index) * '\x02' | (size == sQWORD) << 3 | 8 < (int)base | (8 < (int)op2) << 2;
  if (bVar3 != 0) {
    *stream = bVar3 | 0x40;
  }
  puVar1 = stream + (bVar3 != 0);
  *puVar1 = '1';
  uVar2 = encodeAddress(puVar1 + 1,index,multiplier,base,shift,(int)regCode[op2]);
  return (uVar2 + (int)(puVar1 + 1)) - (int)stream;
}

Assistant:

int x86XOR(unsigned char *stream, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift, x86Reg op2)
{
	unsigned char *start = stream;

	stream += encodeRex(stream, size == sQWORD, op2, index, base);
	*stream++ = 0x31;
	stream += encodeAddress(stream, index, multiplier, base, shift, regCode[op2]);

	return int(stream - start);
}